

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

char * build_gnu_sparse_name(char *dest,char *src)

{
  bool bVar1;
  size_t src_length;
  size_t sVar2;
  char *pcVar3;
  
  if ((src == (char *)0x0) || (*src == '\0')) {
    builtin_strncpy(dest,"GNUSparseFile/blank",0x14);
    return dest;
  }
  src_length = strlen(src);
  sVar2 = src_length;
  if (0 < (long)src_length) {
    do {
      if (src[sVar2 - 1] != '/') {
        if (sVar2 == 1) {
          src_length = 1;
          break;
        }
        src_length = sVar2;
        if ((src[sVar2 - 1] != '.') || (src[sVar2 - 2] != '/')) break;
      }
      src_length = sVar2 - 1;
      bVar1 = 1 < sVar2;
      sVar2 = src_length;
    } while (bVar1);
  }
  pcVar3 = build_ustar_entry_name(dest,src,src_length,"GNUSparseFile.0");
  return pcVar3;
}

Assistant:

static char *
build_gnu_sparse_name(char *dest, const char *src)
{
	const char *p;

	/* Handle the null filename case. */
	if (src == NULL || *src == '\0') {
		strcpy(dest, "GNUSparseFile/blank");
		return (dest);
	}

	/* Prune final '/' and other unwanted final elements. */
	p = src + strlen(src);
	for (;;) {
		/* Ends in "/", remove the '/' */
		if (p > src && p[-1] == '/') {
			--p;
			continue;
		}
		/* Ends in "/.", remove the '.' */
		if (p > src + 1 && p[-1] == '.'
		    && p[-2] == '/') {
			--p;
			continue;
		}
		break;
	}

	/* General case: build a ustar-compatible name adding
	 * "/GNUSparseFile/". */
	build_ustar_entry_name(dest, src, p - src, "GNUSparseFile.0");

	return (dest);
}